

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanabi_history_item.cc
# Opt level: O0

void hanabi_learning_env::ChangeToObserverRelative
               (int observer_pid,int player_count,HanabiHistoryItem *item)

{
  Type TVar1;
  HanabiMove *in_RDX;
  int in_ESI;
  int in_EDI;
  bool bVar2;
  HanabiMove local_18;
  HanabiMove *local_10;
  int local_8;
  int local_4;
  
  local_10 = in_RDX;
  local_8 = in_ESI;
  local_4 = in_EDI;
  TVar1 = HanabiMove::MoveType(in_RDX);
  if (TVar1 == kDeal) {
    bVar2 = false;
    if ((char)local_10[1].move_type_ < '\0') {
      bVar2 = -1 < local_10[1].rank_;
    }
    if (!bVar2) {
      __assert_fail("item->player < 0 && item->deal_to_player >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/hanabi_lib/hanabi_history_item.cc"
                    ,0x3d,
                    "void hanabi_learning_env::ChangeToObserverRelative(int, int, HanabiHistoryItem *)"
                   );
    }
    local_10[1].rank_ = (int8_t)(((local_10[1].rank_ - local_4) + local_8) % local_8);
    if (local_10[1].rank_ == '\0') {
      HanabiMove::HanabiMove(&local_18,kDeal,-1,-1,-1,-1);
      *local_10 = local_18;
    }
  }
  else {
    if ((char)local_10[1].move_type_ < '\0') {
      __assert_fail("item->player >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/hanabi_lib/hanabi_history_item.cc"
                    ,0x45,
                    "void hanabi_learning_env::ChangeToObserverRelative(int, int, HanabiHistoryItem *)"
                   );
    }
    *(char *)&local_10[1].move_type_ =
         (char)((((char)local_10[1].move_type_ - local_4) + local_8) % local_8);
  }
  return;
}

Assistant:

void ChangeToObserverRelative(int observer_pid, int player_count,
                              HanabiHistoryItem* item) {
  if (item->move.MoveType() == HanabiMove::kDeal) {
    assert(item->player < 0 && item->deal_to_player >= 0);
    item->deal_to_player =
        (item->deal_to_player - observer_pid + player_count) % player_count;
    if (item->deal_to_player == 0) {
      // Hide cards dealt to observer.
      item->move = HanabiMove(HanabiMove::kDeal, -1, -1, -1, -1);
    }
  } else {
    assert(item->player >= 0);
    item->player = (item->player - observer_pid + player_count) % player_count;
  }
}